

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[13],kj::String&>
          (String *__return_storage_ptr__,kj *this,char (*params) [13],String *params_1)

{
  ArrayPtr<const_char> *pAVar1;
  kj *local_38;
  size_t local_30;
  ArrayPtr<const_char> local_28;
  
  local_30 = strlen((char *)this);
  pAVar1 = *(ArrayPtr<const_char> **)(*params + 8);
  local_28.ptr = (char *)pAVar1;
  if (pAVar1 != (ArrayPtr<const_char> *)0x0) {
    local_28.ptr = *(char **)*params;
  }
  local_28.size_ = (size_t)(undefined1 *)0x0;
  if (pAVar1 != (ArrayPtr<const_char> *)0x0) {
    local_28.size_ = (size_t)((long)&pAVar1[-1].size_ + 7);
  }
  local_38 = this;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_28,(ArrayPtr<const_char> *)local_28.ptr);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}